

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

mempool * memory_allocate_mempool(uint32_t num_entries,uint32_t entry_size)

{
  mempool *pmVar1;
  uintptr_t *puVar2;
  uint32_t i;
  ulong uVar3;
  uint uVar4;
  uintptr_t *virt;
  uint uVar5;
  dma_memory dVar6;
  
  uVar5 = 0x800;
  if (entry_size != 0) {
    uVar5 = entry_size;
  }
  if ((VFIO_CONTAINER_FILE_DESCRIPTOR == -1) && ((int)(0x200000 % (ulong)uVar5) != 0)) {
    fprintf(_stderr,"[ERROR] %s:%d %s(): entry size must be a divisor of the huge page size (%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x61,
            "memory_allocate_mempool",0x200000);
    abort();
  }
  pmVar1 = (mempool *)malloc((ulong)num_entries * 4 + 0x18);
  uVar4 = 0;
  dVar6 = memory_allocate_dma((ulong)(uVar5 * num_entries),false);
  pmVar1->num_entries = num_entries;
  pmVar1->buf_size = uVar5;
  pmVar1->base_addr = dVar6.virt;
  pmVar1->free_stack_top = num_entries;
  for (uVar3 = 0; num_entries != uVar3; uVar3 = uVar3 + 1) {
    *(int *)(&pmVar1->field_0x14 + uVar3 * 4) = (int)uVar3;
    virt = (uintptr_t *)((ulong)uVar4 + (long)pmVar1->base_addr);
    puVar2 = virt;
    if (VFIO_CONTAINER_FILE_DESCRIPTOR == -1) {
      puVar2 = (uintptr_t *)virt_to_phys(virt);
    }
    *virt = (uintptr_t)puVar2;
    *(int *)(virt + 2) = (int)uVar3;
    virt[1] = (uintptr_t)pmVar1;
    *(undefined4 *)((long)virt + 0x14) = 0;
    uVar4 = uVar4 + uVar5;
  }
  return pmVar1;
}

Assistant:

struct mempool* memory_allocate_mempool(uint32_t num_entries, uint32_t entry_size) {
	entry_size = entry_size ? entry_size : 2048;
	// require entries that neatly fit into the page size, this makes the memory pool much easier
	// otherwise our base_addr + index * size formula would be wrong because we can't cross a page-boundary
	if ((VFIO_CONTAINER_FILE_DESCRIPTOR == -1) && HUGE_PAGE_SIZE % entry_size) {
		error("entry size must be a divisor of the huge page size (%d)", HUGE_PAGE_SIZE);
	}
	struct mempool* mempool = (struct mempool*) malloc(sizeof(struct mempool) + num_entries * sizeof(uint32_t));
	struct dma_memory mem = memory_allocate_dma(num_entries * entry_size, false);
	mempool->num_entries = num_entries;
	mempool->buf_size = entry_size;
	mempool->base_addr = mem.virt;
	mempool->free_stack_top = num_entries;
	for (uint32_t i = 0; i < num_entries; i++) {
		mempool->free_stack[i] = i;
		struct pkt_buf* buf = (struct pkt_buf*) (((uint8_t*) mempool->base_addr) + i * entry_size);
		if (VFIO_CONTAINER_FILE_DESCRIPTOR != -1) {
			// "physical" memory is iova address which is identity mapped to vaddr
			buf->buf_addr_phy = (uintptr_t) buf;
		} else {
			// physical addresses are not contiguous within a pool, we need to get the mapping
			// minor optimization opportunity: this only needs to be done once per page
			buf->buf_addr_phy = virt_to_phys(buf);
		}
		buf->mempool_idx = i;
		buf->mempool = mempool;
		buf->size = 0;
	}
	return mempool;
}